

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void * Curl_hash_pick(Curl_hash *h,void *key,size_t key_len)

{
  Curl_llist *pCVar1;
  void *pvVar2;
  size_t sVar3;
  Curl_llist_element *pCVar4;
  
  pCVar1 = h->table;
  if (pCVar1 != (Curl_llist *)0x0) {
    sVar3 = (*h->hash_func)(key,key_len,(long)h->slots);
    pCVar4 = pCVar1[sVar3].head;
    if (pCVar4 != (Curl_llist_element *)0x0) {
      do {
        pvVar2 = pCVar4->ptr;
        sVar3 = (*h->comp_func)((void *)((long)pvVar2 + 0x28),*(size_t *)((long)pvVar2 + 0x20),key,
                                key_len);
        if (sVar3 != 0) {
          return *(void **)((long)pvVar2 + 0x18);
        }
        pCVar4 = pCVar4->next;
      } while (pCVar4 != (Curl_llist_element *)0x0);
      return (void *)0x0;
    }
  }
  return (void *)0x0;
}

Assistant:

void *
Curl_hash_pick(struct Curl_hash *h, void *key, size_t key_len)
{
  struct Curl_llist_element *le;
  struct Curl_llist *l;

  DEBUGASSERT(h);
  if(h->table) {
    DEBUGASSERT(h->slots);
    l = FETCH_LIST(h, key, key_len);
    for(le = l->head; le; le = le->next) {
      struct Curl_hash_element *he = le->ptr;
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
    }
  }

  return NULL;
}